

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
          (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link,action_e *args,
          uint *args_1)

{
  Pipeline *next;
  unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_> uStack_28;
  undefined8 local_20;
  
  local_20 = *(undefined8 *)(*(undefined8 *)args + 8);
  std::make_unique<Pl_PNGFilter,char_const(&)[1],Pipeline*&,Pl_PNGFilter::action_e,unsigned_int&>
            ((char (*) [1])&uStack_28,(Pipeline **)0x229c86,(action_e *)&local_20,args_1);
  std::
  make_unique<qpdf::pl::Link,std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>,std::unique_ptr<Pl_PNGFilter,std::default_delete<Pl_PNGFilter>>>
            (link,(unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_> *)args);
  std::unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_>::~unique_ptr(&uStack_28);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)link;
}

Assistant:

std::unique_ptr<Link>
    create(std::unique_ptr<Link> link, Args&&... args)
    {
        auto* next = link->next_pl.get();
        return std::make_unique<Link>(
            std::move(link), std::make_unique<P>("", next, std::forward<Args>(args)...));
    }